

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutRec * __thiscall ClipperLib::Clipper::CreateOutRec(Clipper *this)

{
  OutRec *pOVar1;
  OutRec *result;
  Clipper *this_local;
  
  pOVar1 = (OutRec *)operator_new(0x38);
  pOVar1->isHole = false;
  pOVar1->FirstLeft = (OutRec *)0x0;
  pOVar1->AppendLink = (OutRec *)0x0;
  pOVar1->pts = (OutPt *)0x0;
  pOVar1->bottomPt = (OutPt *)0x0;
  pOVar1->sides = esNeither;
  pOVar1->bottomFlag = (OutPt *)0x0;
  return pOVar1;
}

Assistant:

OutRec* Clipper::CreateOutRec()
{
  OutRec* result = new OutRec;
  result->isHole = false;
  result->FirstLeft = 0;
  result->AppendLink = 0;
  result->pts = 0;
  result->bottomPt = 0;
  result->sides = esNeither;
  result->bottomFlag = 0;

  return result;
}